

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcastu.c
# Opt level: O2

int castmu(monst *mtmp,attack *mattk,boolean thinks_it_foundyou,boolean foundyou)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  boolean bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint *puVar8;
  char *pcVar9;
  obj *poVar10;
  permonst *ppVar11;
  monst *mtmp_00;
  undefined7 in_register_00000009;
  byte bVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  char *pcVar17;
  long xtime;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  coord local_3e;
  undefined4 local_3c;
  permonst *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000009,foundyou);
  bVar1 = mtmp->m_lev;
  bVar2 = mattk->adtyp;
  uVar16 = (uint)bVar2;
  uVar15 = (uint)bVar1;
  local_38 = (permonst *)mattk;
  if (bVar2 == 0xf1) {
    if (uVar15 == 0) {
      uVar18 = 0;
      uVar16 = 0xf1;
    }
    else {
LAB_001b8caf:
      uVar14 = 0x29;
      do {
        uVar5 = mt_random();
        bVar2 = *(byte *)((long)&local_38->mname + 1);
        uVar16 = (uint)bVar2;
        bVar12 = (char)(uVar5 % uVar15) - 1;
        if (bVar2 == 0xf1) {
          if (0x15 < bVar12) goto LAB_001b8d03;
          puVar8 = (uint *)(&DAT_0029cc8c + (ulong)bVar12 * 4);
LAB_001b8cfe:
          uVar18 = (ulong)*puVar8;
        }
        else {
          if (bVar12 < 0xd) {
            puVar8 = (uint *)(&DAT_0029cce4 + (ulong)bVar12 * 4);
            goto LAB_001b8cfe;
          }
LAB_001b8d03:
          uVar18 = 0;
        }
        iVar7 = (int)uVar18;
        if (thinks_it_foundyou == '\0') {
          bVar4 = is_undirected_spell((uint)bVar2,iVar7);
          if ((bVar4 == '\0') ||
             (bVar4 = spell_would_be_useless(mtmp,(uint)bVar2,iVar7), bVar4 != '\0')) {
            if ((char)local_3c == '\0') {
              return 0;
            }
            warning("spellcasting monster found you and doesn\'t know it?");
            return 0;
          }
          break;
        }
        uVar14 = uVar14 - 1;
        if (uVar14 < 2) {
          return 0;
        }
        bVar4 = spell_would_be_useless(mtmp,(uint)bVar2,iVar7);
      } while (bVar4 != '\0');
    }
  }
  else {
    uVar18 = 0;
    if (bVar2 == 0xf0 && bVar1 != 0) goto LAB_001b8caf;
  }
  ppVar11 = local_38;
  uVar14 = *(uint *)&mtmp->field_0x60;
  iVar7 = (int)uVar18;
  if (((uVar14 >> 8 & 1) != 0) || (mtmp->mspec_used != 0 || bVar1 == 0)) {
    bVar4 = is_undirected_spell(uVar16,iVar7);
    cursetxt(mtmp,bVar4);
    return 0;
  }
  if (((byte)uVar16 & 0xfe) == 0xf0) {
    iVar6 = 10 - (uint)mtmp->m_lev;
    if (8 < mtmp->m_lev) {
      iVar6 = 2;
    }
    iVar13 = 0;
    if (mtmp->data->msound != '\x1f') {
      iVar13 = iVar6;
    }
    mtmp->mspec_used = iVar13;
  }
  if ((thinks_it_foundyou != '\0' && (char)local_3c == '\0') &&
     (bVar4 = is_undirected_spell((uint)*(byte *)((long)&local_38->mname + 1),iVar7), bVar4 == '\0')
     ) {
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_001b9955;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001b8fd2;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001b8fc9;
      }
      else {
LAB_001b8fc9:
        if (ublindf == (obj *)0x0) goto LAB_001b99b5;
LAB_001b8fd2:
        if (ublindf->oartifact != '\x1d') goto LAB_001b99b5;
      }
      if ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
         (((youmonst.data)->mflags3 & 0x100) != 0)) {
        pcVar9 = "Something";
        if (((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) || ((mtmp->data->mflags3 & 0x200) == 0))
        goto LAB_001b99bc;
        goto LAB_001b9955;
      }
    }
    else {
      bVar4 = worm_known(level,mtmp);
      if (bVar4 != '\0') {
        uVar14 = *(uint *)&mtmp->field_0x60;
LAB_001b9955:
        if ((((uVar14 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) {
          if ((uVar14 & 0x280) != 0) goto LAB_001b99b5;
        }
        else {
          pcVar9 = "Something";
          if (((uVar14 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
          goto LAB_001b99bc;
        }
        if ((u._1052_1_ & 0x20) == 0) {
          pcVar9 = Monnam(mtmp);
          goto LAB_001b99bc;
        }
      }
    }
LAB_001b99b5:
    pcVar9 = "Something";
LAB_001b99bc:
    pcVar17 = "thin air";
    if (level->locations[mtmp->mux][mtmp->muy].typ == '\x13') {
      pcVar17 = "empty water";
    }
    pline("%s casts a spell at %s!",pcVar9,pcVar17);
    return 0;
  }
  nomul(0,(char *)0x0);
  uVar5 = mt_random();
  uVar16 = *(uint *)&mtmp->field_0x60;
  uVar14 = 100;
  if ((uVar16 >> 0x15 & 1) == 0) {
    uVar14 = 0x14;
  }
  if (uVar5 % (uVar15 * 10) < uVar14) {
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001b8f1f;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001b8f16;
        }
        else {
LAB_001b8f16:
          if (ublindf == (obj *)0x0) {
            return 0;
          }
LAB_001b8f1f:
          if (ublindf->oartifact != '\x1d') {
            return 0;
          }
        }
        if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) {
          return 0;
        }
        if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
          return 0;
        }
        if ((mtmp->data->mflags3 & 0x200) == 0) {
          return 0;
        }
      }
    }
    else {
      bVar4 = worm_known(level,mtmp);
      if (bVar4 == '\0') {
        return 0;
      }
      uVar16 = *(uint *)&mtmp->field_0x60;
    }
    if ((((uVar16 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((uVar16 & 0x280) != 0) {
        return 0;
      }
    }
    else {
      if ((uVar16 & 0x280) != 0) {
        return 0;
      }
      if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
        return 0;
      }
    }
    if ((u._1052_1_ & 0x20) != 0) {
      return 0;
    }
    if (flags.soundok == '\0') {
      return 0;
    }
    pcVar9 = mon_nam(mtmp);
    pcVar17 = "The air crackles around %s.";
    iVar7 = 0;
    goto LAB_001b90d5;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001b8f79;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001b8f70;
      }
      else {
LAB_001b8f70:
        if (ublindf == (obj *)0x0) goto LAB_001b9188;
LAB_001b8f79:
        if (ublindf->oartifact != '\x1d') goto LAB_001b9188;
      }
      if (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
          (((youmonst.data)->mflags3 & 0x100) == 0)) ||
         (((viz_array[mtmp->my][mtmp->mx] & 1U) == 0 || ((mtmp->data->mflags3 & 0x200) == 0))))
      goto LAB_001b9188;
    }
LAB_001b913b:
    if ((((uVar16 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)) {
      if (((uVar16 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_001b917b;
      goto LAB_001b9188;
    }
    if ((uVar16 & 0x280) != 0) goto LAB_001b9188;
LAB_001b917b:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_001b9188;
LAB_001b92d3:
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001b933b;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001b9332;
        }
        else {
LAB_001b9332:
          if (ublindf == (obj *)0x0) goto LAB_001b93ea;
LAB_001b933b:
          if (ublindf->oartifact != '\x1d') goto LAB_001b93ea;
        }
        if (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
            (((youmonst.data)->mflags3 & 0x100) == 0)) ||
           (((viz_array[mtmp->my][mtmp->mx] & 1U) == 0 || ((mtmp->data->mflags3 & 0x200) == 0))))
        goto LAB_001b93ea;
      }
LAB_001b9396:
      uVar16 = *(uint *)&mtmp->field_0x60;
      if ((((uVar16 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0))
      {
        if (((uVar16 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
        goto LAB_001b93dd;
        goto LAB_001b93ea;
      }
      if ((uVar16 & 0x280) != 0) goto LAB_001b93ea;
LAB_001b93dd:
      if ((u._1052_1_ & 0x20) != 0) goto LAB_001b93ea;
LAB_001b9535:
      pcVar9 = Monnam(mtmp);
    }
    else {
      bVar4 = worm_known(level,mtmp);
      if (bVar4 != '\0') goto LAB_001b9396;
LAB_001b93ea:
      if (((mtmp->data->mflags1 & 0x10000) == 0) &&
         ((poVar10 = which_armor(mtmp,4), poVar10 == (obj *)0x0 ||
          (poVar10 = which_armor(mtmp,4), poVar10->otyp != 0x4f)))) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001b943d;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001b9438;
        }
        else {
LAB_001b9438:
          if (ublindf != (obj *)0x0) {
LAB_001b943d:
            if (ublindf->oartifact == '\x1d') goto LAB_001b94cd;
          }
          if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
               (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
               youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001b9535;
        }
LAB_001b94cd:
        if ((u.uprops[0x19].extrinsic != 0) &&
           ((u.uprops[0x19].blocked == 0 &&
            (iVar6 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar6 < 0x41))))
        goto LAB_001b9535;
      }
      if ((u.uprops[0x42].intrinsic != 0) ||
         ((u.uprops[0x42].extrinsic != 0 || (bVar4 = match_warn_of_mon(mtmp), bVar4 != '\0'))))
      goto LAB_001b9535;
      pcVar9 = "Something";
    }
    bVar4 = is_undirected_spell((uint)*(byte *)((long)&ppVar11->mname + 1),iVar7);
    if (bVar4 == '\0') {
      if (((((((youmonst.data != mons + 0x7b && youmonst.data != mons + 0x9e) &&
               (u.uprops[0xd].extrinsic == 0 && u.uprops[0xd].intrinsic == 0)) ||
             (u.uprops[0xd].blocked != 0)) || (u.uprops[0xc].intrinsic != 0)) ||
           ((u.uprops[0xc].extrinsic != 0 || (((youmonst.data)->mflags1 & 0x1000000) != 0)))) ||
          ((mtmp->data->mflags1 & 0x1000000) != 0)) ||
         ((pcVar17 = " at a spot near you", mtmp->mux == u.ux && (mtmp->muy == u.uy)))) {
        if (u.uprops[0x2d].extrinsic == 0) {
          pcVar17 = " at you";
        }
        else if (mtmp->mux == u.ux) {
          pcVar17 = " at your displaced image";
          if (mtmp->muy == u.uy) {
            pcVar17 = " at you";
          }
        }
        else {
          pcVar17 = " at your displaced image";
        }
      }
    }
    else {
      pcVar17 = "";
    }
    pline("%s casts a spell%s!",pcVar9,pcVar17);
  }
  else {
    bVar4 = worm_known(level,mtmp);
    if (bVar4 != '\0') {
      uVar16 = *(uint *)&mtmp->field_0x60;
      goto LAB_001b913b;
    }
LAB_001b9188:
    if (((mtmp->data->mflags1 & 0x10000) == 0) &&
       ((poVar10 = which_armor(mtmp,4), poVar10 == (obj *)0x0 ||
        (poVar10 = which_armor(mtmp,4), poVar10->otyp != 0x4f)))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001b91db;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001b91d6;
      }
      else {
LAB_001b91d6:
        if (ublindf != (obj *)0x0) {
LAB_001b91db:
          if (ublindf->oartifact == '\x1d') goto LAB_001b926b;
        }
        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001b92d3;
      }
LAB_001b926b:
      if ((u.uprops[0x19].extrinsic != 0) &&
         ((u.uprops[0x19].blocked == 0 &&
          (iVar6 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar6 < 0x41))))
      goto LAB_001b92d3;
    }
    if ((u.uprops[0x42].intrinsic != 0) ||
       (((u.uprops[0x42].extrinsic != 0 || (bVar4 = match_warn_of_mon(mtmp), bVar4 != '\0')) ||
        (bVar4 = is_undirected_spell((uint)*(byte *)((long)&ppVar11->mname + 1),iVar7),
        bVar4 == '\0')))) goto LAB_001b92d3;
  }
  if ((char)local_3c == '\0') {
    uVar15 = 0;
    if (((ulong)ppVar11->mname & 0xfe00) != 0xf000) {
      pcVar9 = Monnam(mtmp);
      warning("%s casting non-hand-to-hand version of hand-to-hand spell %d?",pcVar9,
              (ulong)*(byte *)((long)&ppVar11->mname + 1));
      return 0;
    }
  }
  else {
    bVar2 = *(byte *)((long)&ppVar11->mname + 3);
    uVar16 = (uint)bVar2;
    bVar12 = 0x1e;
    if (uVar15 < 0x1e) {
      bVar12 = bVar1;
    }
    if (bVar2 == 0) {
      uVar15 = (uint)(byte)(bVar12 / 5 + 1);
      uVar16 = 6;
    }
    else {
      uVar15 = (uint)*(byte *)((long)&ppVar11->mname + 2) + (uint)(bVar12 / 5);
    }
    uVar15 = dice(uVar15,uVar16);
  }
  if (u.uprops[0x32].intrinsic != 0 || u.uprops[0x32].extrinsic != 0) {
    uVar15 = (int)(uVar15 + 1) / 2;
  }
  cVar3 = *(char *)((long)&local_38->mname + 1);
  if (cVar3 == '\x01') {
    pline("You are hit by a shower of missiles!");
    mana_damageu(uVar15,mtmp,(char *)0x0,0,'\x01');
    return 1;
  }
  if (cVar3 == -0xf) {
    if (uVar15 != 0) {
      iVar7 = (*(code *)((long)&DAT_0029cc34 + (long)(int)(&DAT_0029cc34)[uVar18]))();
      return iVar7;
    }
    switch(iVar7) {
    case 1:
switchD_001b97b1_caseD_1:
      if (mtmp->mhpmax <= mtmp->mhp) goto LAB_001b9f6f;
      if (mtmp->wormno == '\0') {
        if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001ba18d;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001ba184;
          }
          else {
LAB_001ba184:
            if (ublindf == (obj *)0x0) goto LAB_001ba799;
LAB_001ba18d:
            if (ublindf->oartifact != '\x1d') goto LAB_001ba799;
          }
          if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
               (((youmonst.data)->mflags3 & 0x100) == 0)) ||
              ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0)) || ((mtmp->data->mflags3 & 0x200) == 0))
          goto LAB_001ba799;
        }
      }
      else {
        bVar4 = worm_known(level,mtmp);
        if (bVar4 == '\0') goto LAB_001ba799;
      }
      uVar15 = *(uint *)&mtmp->field_0x60;
      if ((((uVar15 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar15 & 0x280) != 0) goto LAB_001ba799;
      }
      else if (((uVar15 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
      goto LAB_001ba799;
      if ((u._1052_1_ & 0x20) == 0) {
        pcVar9 = Monnam(mtmp);
        pline("%s looks better.",pcVar9);
      }
LAB_001ba799:
      iVar7 = dice(3,6);
      iVar7 = iVar7 + mtmp->mhp;
      if (mtmp->mhpmax <= iVar7) {
        iVar7 = mtmp->mhpmax;
      }
      mtmp->mhp = iVar7;
      return 1;
    case 2:
      mon_adjust_speed(mtmp,1,(obj *)0x0);
      return 1;
    default:
      pcVar9 = "cast directed wizard spell (%d) with dmg=0?";
      goto LAB_001b9f52;
    case 4:
      uVar16 = *(uint *)&mtmp->field_0x60;
      if ((uVar16 & 6) == 0) {
        if (mtmp->wormno == '\0') {
          if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001ba571;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001ba568;
            }
            else {
LAB_001ba568:
              if (ublindf == (obj *)0x0) goto LAB_001ba8e1;
LAB_001ba571:
              if (ublindf->oartifact != '\x1d') goto LAB_001ba8e1;
            }
            if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                 (((youmonst.data)->mflags3 & 0x100) == 0)) ||
                ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0)) || ((mtmp->data->mflags3 & 0x200) == 0)
               ) goto LAB_001ba8e1;
          }
        }
        else {
          bVar4 = worm_known(level,mtmp);
          if (bVar4 == '\0') goto LAB_001ba8e1;
          uVar16 = *(uint *)&mtmp->field_0x60;
        }
        if ((((uVar16 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) {
          if ((uVar16 & 0x280) != 0) goto LAB_001ba8e1;
        }
        else if (((uVar16 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
        goto LAB_001ba8e1;
        if ((u._1052_1_ & 0x20) == 0) {
          pcVar9 = Monnam(mtmp);
          if (u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0) {
            pcVar17 = "becomes transparent";
            if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
              pcVar17 = "disappears";
            }
          }
          else {
            pcVar17 = "becomes transparent";
          }
          pline("%s suddenly %s!",pcVar9,pcVar17);
        }
LAB_001ba8e1:
        mon_set_minvis(mtmp);
        return 1;
      }
      pcVar9 = "no reason for monster to cast disappear spell?";
      break;
    case 8:
      pline("You feel that monsters are aware of your presence.");
      aggravate();
      return 1;
    case 9:
      iVar7 = nasty(mtmp);
      if ((mtmp->field_0x63 & 0x20) != 0) {
        pcVar9 = "s";
        if (iVar7 == 1) {
          pcVar9 = "";
        }
        verbalize("Destroy the thief, my pet%s!",pcVar9);
        return 1;
      }
      pcVar9 = "Monsters appear";
      if (iVar7 == 1) {
        pcVar9 = "A monster appears";
      }
      if (((((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
             (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
           (u.uprops[0xd].blocked == 0)) && (u.uprops[0xc].intrinsic == 0)) &&
         (((u.uprops[0xc].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000000) == 0)) &&
          (((mtmp->data->mflags1 & 0x1000000) == 0 && ((mtmp->mux != u.ux || (mtmp->muy != u.uy)))))
          ))) {
        pcVar17 = "%s around a spot near you!";
      }
      else if ((u.uprops[0x2d].extrinsic == 0) || ((mtmp->mux == u.ux && (mtmp->muy == u.uy)))) {
        pcVar17 = "%s from nowhere!";
      }
      else {
        pcVar17 = "%s around your displaced image!";
      }
LAB_001ba58f:
      pline(pcVar17,pcVar9);
      return 1;
    case 10:
      if (((mtmp->field_0x63 & 0x20) != 0) && (flags.no_of_wizards == 1)) {
        pline("Double Trouble...");
        clonewiz();
        return 1;
      }
      pcVar9 = "bad wizard cloning?";
    }
LAB_001b9f68:
    warning(pcVar9);
    goto LAB_001b9f6f;
  }
  if (cVar3 == '\x03') {
    pline("You\'re covered in frost!");
    cold_damageu(uVar15,mtmp,(char *)0x0,0,0);
    return 1;
  }
  if (cVar3 != -0x10) {
    if (cVar3 == '\x02') {
      pline("You\'re enveloped in flames!");
      fire_damageu(uVar15,mtmp,(char *)0x0,0,0,'\x01','\x01');
      return 1;
    }
    if (uVar15 != 0) {
      mdamageu(mtmp,uVar15);
      return 1;
    }
    return 1;
  }
  if ((uVar15 == 0) && ((iVar7 - 1U & 0xfffffffb) != 0)) {
    pcVar9 = "cast directed cleric spell (%d) with dmg=0?";
LAB_001b9f52:
    warning(pcVar9,uVar18);
    return 1;
  }
  switch(uVar18) {
  case 0:
    if ((u.uprops[0x2c].extrinsic != 0) ||
       ((u.umonnum != u.umonster && (bVar4 = resists_magm(&youmonst), bVar4 != '\0')))) {
      shieldeff(u.ux,u.uy);
      uVar15 = (int)(uVar15 + 1) / 2;
    }
    if ((int)uVar15 < 6) {
      pline("Your skin itches badly for a moment.");
      goto LAB_001b9f6f;
    }
    pcVar9 = "Your body is covered with painful wounds!";
    if (uVar15 < 0x15) {
      pcVar9 = "Severe wounds appear on your body!";
    }
    pcVar17 = "Wounds appear on your body!";
    if (10 < uVar15) {
      pcVar17 = pcVar9;
    }
    pline(pcVar17);
    goto LAB_001b9f77;
  case 1:
    goto switchD_001b97b1_caseD_1;
  case 2:
    if ((u.uprops[0x2c].extrinsic == 0) &&
       ((u.umonnum == u.umonster || (bVar4 = resists_magm(&youmonst), bVar4 == '\0')))) {
      uVar15 = u.uprops[0x1c].intrinsic;
      uVar16 = mtmp->m_lev + 1 >> 1;
      if (u.uprops[0x32].extrinsic == 0 && u.uprops[0x32].intrinsic == 0) {
        uVar16 = (uint)mtmp->m_lev;
      }
      iVar7 = 1;
      make_confused((ulong)(uVar16 + u.uprops[0x1c].intrinsic),'\x01');
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar4 = dmgtype(youmonst.data,0x24), bVar4 != '\0')))) {
        pcVar9 = "more ";
        if (uVar15 == 0) {
          pcVar9 = "";
        }
        pcVar17 = "You feel %sconfused!";
      }
      else {
        pcVar9 = "trippier";
        if (uVar15 == 0) {
          pcVar9 = "trippy";
        }
        pcVar17 = "You feel %s!";
      }
LAB_001b90d5:
      pline(pcVar17,pcVar9);
      return iVar7;
    }
    shieldeff(u.ux,u.uy);
    pcVar9 = "You feel momentarily dizzy.";
    goto LAB_001ba10f;
  case 3:
    if ((u.uprops[0x2c].extrinsic == 0) &&
       (((u.umonnum == u.umonster || (bVar4 = resists_magm(&youmonst), bVar4 == '\0')) &&
        (u.uprops[0x38].extrinsic == 0)))) {
      if (-1 < multi) {
        pline("You are frozen in place!");
      }
      uVar15 = mtmp->m_lev + 5 >> 1;
      if (u.uprops[0x32].extrinsic == 0 && u.uprops[0x32].intrinsic == 0) {
        uVar15 = mtmp->m_lev + 4;
      }
      iVar7 = -uVar15;
    }
    else {
      shieldeff(u.ux,u.uy);
      if (-1 < multi) {
        pline("You stiffen briefly.");
      }
      iVar7 = -1;
    }
    nomul(iVar7,"paralyzed by a monster");
    break;
  case 4:
    if (u.uprops[0x1e].intrinsic != 0) {
      pcVar9 = "no reason for monster to cast blindness spell?";
      goto LAB_001b9f68;
    }
    if ((((youmonst.data)->mflags1 & 0x1000) == 0) &&
       (youmonst.data == mons + 0x1e || youmonst.data == mons + 0x17b)) {
      body_part(1);
    }
    else {
      pcVar9 = body_part(1);
      makeplural(pcVar9);
    }
    pline("Scales cover your %s!");
    xtime = 200;
    if (u.uprops[0x32].extrinsic != 0 || u.uprops[0x32].intrinsic != 0) {
      xtime = 100;
    }
    make_blinded(xtime,'\0');
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001ba380;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001ba377;
    }
    else {
LAB_001ba377:
      if (ublindf == (obj *)0x0) {
        return 1;
      }
LAB_001ba380:
      if (ublindf->oartifact != '\x1d') {
        return 1;
      }
    }
    pcVar9 = "Your vision quickly clears.";
LAB_001ba10f:
    pline(pcVar9);
    break;
  case 5:
    uVar15 = 1;
    ppVar11 = mkclass(&u.uz,'\x01',0);
    cVar3 = '-';
    if (ppVar11 != (permonst *)0x0) {
      cVar3 = '\x01';
    }
    if (1 < mtmp->m_lev) {
      uVar15 = rnd((uint)(mtmp->m_lev >> 1));
    }
    bVar20 = ppVar11 != (permonst *)0x0;
    uVar16 = 3;
    if (3 < uVar15) {
      uVar16 = uVar15;
    }
    iVar7 = uVar16 + 1;
    local_38 = ppVar11;
    while ((bVar19 = iVar7 != 0, iVar7 = iVar7 + -1, bVar19 &&
           (bVar4 = enexto(&local_3e,level,mtmp->mux,mtmp->muy,mtmp->data), bVar4 != '\0'))) {
      ppVar11 = mkclass(&u.uz,cVar3,0);
      if ((ppVar11 != (permonst *)0x0) &&
         (mtmp_00 = makemon(ppVar11,level,(int)local_3e.x,(int)local_3e.y,0),
         mtmp_00 != (monst *)0x0)) {
        mtmp_00->mtame = '\0';
        mtmp_00->field_0x62 = mtmp_00->field_0x62 & 0xb7;
        set_malign(mtmp_00);
        bVar20 = true;
      }
    }
    if (bVar20) {
      if (local_38 == (permonst *)0x0) {
        pcVar9 = Monnam(mtmp);
        pcVar17 = "%s transforms a clump of sticks into snakes!";
      }
      else if ((((((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
                   (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
                 (u.uprops[0xd].blocked == 0)) && (u.uprops[0xc].intrinsic == 0)) &&
               ((u.uprops[0xc].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000000) == 0)))) &&
              (((mtmp->data->mflags1 & 0x1000000) == 0 &&
               ((mtmp->mux != u.ux || (mtmp->muy != u.uy)))))) {
        pcVar9 = Monnam(mtmp);
        pcVar17 = "%s summons insects around a spot near you!";
      }
      else if ((u.uprops[0x2d].extrinsic == 0) || ((mtmp->mux == u.ux && (mtmp->muy == u.uy)))) {
        pcVar9 = Monnam(mtmp);
        pcVar17 = "%s summons insects!";
      }
      else {
        pcVar9 = Monnam(mtmp);
        pcVar17 = "%s summons insects around your displaced image!";
      }
    }
    else {
      pcVar9 = Monnam(mtmp);
      pcVar17 = "%s casts at a clump of sticks, but nothing happens.";
    }
    goto LAB_001ba58f;
  case 6:
    pline("You feel as if you need some help.");
    rndcurse();
    break;
  case 7:
    pline("A bolt of lightning strikes down at you from above!");
    bVar4 = ureflects("It bounces off your %s%s.","");
    if (bVar4 == '\0') {
      iVar7 = dice((uint)(u.uprops[0x32].extrinsic == 0 && u.uprops[0x32].intrinsic == 0) * 4 + 4,6)
      ;
      elec_damageu(iVar7,mtmp,(char *)0x0,0,0x14,'\x01');
      return 1;
    }
    break;
  case 8:
    pline("A pillar of fire strikes all around you!");
    iVar7 = dice((uint)(u.uprops[0x32].extrinsic == 0 && u.uprops[0x32].intrinsic == 0) * 4 + 4,6);
    fire_damageu(iVar7,mtmp,(char *)0x0,0,0x14,'\x01','\x01');
    burn_floor_paper((int)u.ux,(int)u.uy,'\x01','\0');
    return 1;
  case 9:
    pline("A sudden geyser slams into you from nowhere!");
    uVar15 = dice(8,6);
    if (u.uprops[0x33].extrinsic != 0 || u.uprops[0x33].intrinsic != 0) {
      uVar15 = (int)(uVar15 + 1) / 2;
    }
LAB_001b9f6f:
    if (uVar15 == 0) {
      return 1;
    }
LAB_001b9f77:
    mdamageu(mtmp,uVar15);
    break;
  default:
    pcVar9 = "mcastu: invalid clerical spell (%d)";
    goto LAB_001b9f52;
  }
  return 1;
}

Assistant:

int castmu(struct monst *mtmp,
	   const struct attack *mattk,
	   boolean thinks_it_foundyou,
	   boolean foundyou)
{
	int	dmg, ml = mtmp->m_lev;
	int ret;
	int spellnum = 0;

	/* Three cases:
	 * -- monster is attacking you.  Search for a useful spell.
	 * -- monster thinks it's attacking you.  Search for a useful spell,
	 *    without checking for undirected.  If the spell found is directed,
	 *    it fails with cursetxt() and loss of mspec_used.
	 * -- monster isn't trying to attack.  Select a spell once.  Don't keep
	 *    searching; if that spell is not useful (or if it's directed),
	 *    return and do something else. 
	 * Since most spells are directed, this means that a monster that isn't
	 * attacking casts spells only a small portion of the time that an
	 * attacking monster does.
	 */
	if ((mattk->adtyp == AD_SPEL || mattk->adtyp == AD_CLRC) && ml) {
	    int cnt = 40;

	    do {
		spellnum = rn2(ml);
		if (mattk->adtyp == AD_SPEL)
		    spellnum = choose_magic_spell(spellnum);
		else
		    spellnum = choose_clerical_spell(spellnum);
		/* not trying to attack?  don't allow directed spells */
		if (!thinks_it_foundyou) {
		    if (!is_undirected_spell(mattk->adtyp, spellnum) ||
			spell_would_be_useless(mtmp, mattk->adtyp, spellnum)) {
			if (foundyou)
			    warning("spellcasting monster found you and doesn't know it?");
			return 0;
		    }
		    break;
		}
	    } while (--cnt > 0 &&
		    spell_would_be_useless(mtmp, mattk->adtyp, spellnum));
	    if (cnt == 0) return 0;
	}

	/* monster unable to cast spells? */
	if (mtmp->mcan || mtmp->mspec_used || !ml) {
	    cursetxt(mtmp, is_undirected_spell(mattk->adtyp, spellnum));
	    return 0;
	}

	if (mattk->adtyp == AD_SPEL || mattk->adtyp == AD_CLRC) {
	    mtmp->mspec_used = 10 - mtmp->m_lev;
	    if (mtmp->mspec_used < 2) mtmp->mspec_used = 2;
	    /* your quest leader is a badass and does not need recharge time */
	    if (mtmp->data->msound == MS_LEADER) mtmp->mspec_used = 0;
	}

	/* monster can cast spells, but is casting a directed spell at the
	   wrong place?  If so, give a message, and return.  Do this *after*
	   penalizing mspec_used. */
	if (!foundyou && thinks_it_foundyou &&
		!is_undirected_spell(mattk->adtyp, spellnum)) {
	    pline("%s casts a spell at %s!",
		canseemon(level, mtmp) ? Monnam(mtmp) : "Something",
		level->locations[mtmp->mux][mtmp->muy].typ == WATER
		    ? "empty water" : "thin air");
	    return 0;
	}

	nomul(0, NULL);
	if (rn2(ml*10) < (mtmp->mconf ? 100 : 20)) {	/* fumbled attack */
	    if (canseemon(level, mtmp) && flags.soundok)
		pline("The air crackles around %s.", mon_nam(mtmp));
	    return 0;
	}
	if (canspotmon(level, mtmp) || !is_undirected_spell(mattk->adtyp, spellnum)) {
	    pline("%s casts a spell%s!",
		  canspotmon(level, mtmp) ? Monnam(mtmp) : "Something",
		  is_undirected_spell(mattk->adtyp, spellnum) ? "" :
		  (Invisible && !perceives(mtmp->data) && 
		   (mtmp->mux != u.ux || mtmp->muy != u.uy)) ?
		  " at a spot near you" :
		  (Displaced && (mtmp->mux != u.ux || mtmp->muy != u.uy)) ?
		  " at your displaced image" :
		  " at you");
	}

/*
 *	As these are spells, the damage is related to the level
 *	of the monster casting the spell.
 */
	if (!foundyou) {
	    dmg = 0;
	    if (mattk->adtyp != AD_SPEL && mattk->adtyp != AD_CLRC) {
		warning(
	      "%s casting non-hand-to-hand version of hand-to-hand spell %d?",
			   Monnam(mtmp), mattk->adtyp);
		return 0;
	    }
	} else if (mattk->damd) {
	    dmg = dice(min(ml, 30) / 5 + mattk->damn, mattk->damd);
	} else {
	    dmg = dice(min(ml, 30) / 5 + 1, 6);
	}
	if (Half_spell_damage) dmg = (dmg+1) / 2;

	ret = 1;

	switch (mattk->adtyp) {

	    case AD_FIRE:
		pline("You're enveloped in flames!");
		fire_damageu(dmg, mtmp, NULL, 0, 0, TRUE, TRUE);
		dmg = 0;
		break;
	    case AD_COLD:
		pline("You're covered in frost!");
		cold_damageu(dmg, mtmp, NULL, 0, 0);
		dmg = 0;
		break;
	    case AD_MAGM:
		pline("You are hit by a shower of missiles!");
		mana_damageu(dmg, mtmp, NULL, 0, TRUE);
		dmg = 0;
		break;
	    case AD_SPEL:	/* wizard spell */
	    case AD_CLRC:       /* clerical spell */
	    {
		if (mattk->adtyp == AD_SPEL)
		    cast_wizard_spell(mtmp, dmg, spellnum);
		else
		    cast_cleric_spell(mtmp, dmg, spellnum);
		dmg = 0; /* done by the spell casting functions */
		break;
	    }
	}
	if (dmg) mdamageu(mtmp, dmg);
	return ret;
}